

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall flatbuffers::Parser::SkipAnyJsonValue(Parser *this)

{
  int iVar1;
  long lVar2;
  int t;
  long in_RSI;
  char cVar3;
  CheckedError *ce;
  bool bVar4;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  iVar1 = *(int *)(in_RSI + 0x77c);
  if (0x40 < iVar1) {
    __assert_fail("caller_depth_ <= (FLATBUFFERS_MAX_PARSING_DEPTH) && \"Check() must be called to prevent stack overflow\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                  ,0x19d,"flatbuffers::Parser::ParseDepthGuard::ParseDepthGuard(Parser *)");
  }
  *(int *)(in_RSI + 0x77c) = iVar1 + 1;
  if (iVar1 == 0x40) {
    RecurseError(this);
  }
  else {
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d30f;
  iVar1 = *(int *)(in_RSI + 0x1c);
  if (iVar1 < 0x101) {
    t = (int)in_RSI;
    if (iVar1 == 0x5b) {
      Expect(this,t);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        lVar2 = 0;
        do {
          bVar4 = lVar2 == 0;
          lVar2 = lVar2 + -1;
          if ((bVar4 || (~*(byte *)(in_RSI + 0x3ea) & 1) != 0) && (*(int *)(in_RSI + 0x1c) == 0x5d))
          {
LAB_0010d3b7:
            Next(this);
            goto LAB_0010d2fe;
          }
          SkipAnyJsonValue(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
          if (*(int *)(in_RSI + 0x1c) == 0x5d) goto LAB_0010d3b7;
          if (*(char *)(in_RSI + 0x548) == '\0') {
            Expect(this,t);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') goto LAB_0010d3a1;
          }
          else {
LAB_0010d3a1:
            *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
          }
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        } while (*(char *)&(this->super_ParserState).prev_cursor_ == '\0');
      }
      goto LAB_0010d30f;
    }
    if (iVar1 != 0x7b) goto LAB_0010d28f;
    Expect(this,t);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d30f;
    lVar2 = 0;
    do {
      if (((byte)(lVar2 == 0 | *(byte *)(in_RSI + 0x3ea) ^ 1) == 1) &&
         (*(int *)(in_RSI + 0x1c) == 0x7d)) goto LAB_0010d264;
      local_48 = 0;
      local_40 = 0;
      local_50 = &local_40;
      std::__cxx11::string::_M_assign((string *)&local_50);
      if (*(int *)(in_RSI + 0x1c) == 0x101) {
        Next(this);
      }
      else {
        Expect(this,t);
      }
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      cVar3 = '\x01';
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        if ((*(char *)(in_RSI + 0x548) != '\x01') || ((*(uint *)(in_RSI + 0x1c) | 0x20) != 0x7b)) {
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          cVar3 = '\x01';
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010d23a;
        }
        SkipAnyJsonValue(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          lVar2 = lVar2 + 1;
          *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
        }
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        cVar3 = '\x01';
        if ((*(char *)&(this->super_ParserState).prev_cursor_ == '\0') &&
           (cVar3 = '\x02', *(int *)(in_RSI + 0x1c) != 0x7d)) {
          if (*(char *)(in_RSI + 0x548) == '\0') {
            Expect(this,t);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') goto LAB_0010d22b;
          }
          else {
LAB_0010d22b:
            *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
          }
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          cVar3 = *(char *)&(this->super_ParserState).prev_cursor_;
        }
      }
LAB_0010d23a:
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
    } while (cVar3 == '\0');
    if (cVar3 != '\x02') goto LAB_0010d30f;
LAB_0010d264:
    Next(this);
  }
  else if (iVar1 - 0x101U < 3) {
    Next(this);
  }
  else {
    if ((iVar1 != 0x104) ||
       (iVar1 = std::__cxx11::string::compare((char *)(in_RSI + 0x28)), iVar1 != 0)) {
LAB_0010d28f:
      if ((((*(int *)(in_RSI + 0x1c) != 0x104) ||
           (iVar1 = std::__cxx11::string::compare((char *)(in_RSI + 0x28)), iVar1 != 0)) &&
          ((*(int *)(in_RSI + 0x1c) != 0x104 ||
           (iVar1 = std::__cxx11::string::compare((char *)(in_RSI + 0x28)), iVar1 != 0)))) &&
         ((*(int *)(in_RSI + 0x1c) != 0x104 ||
          (iVar1 = std::__cxx11::string::compare((char *)(in_RSI + 0x28)), iVar1 != 0)))) {
        TokenError(this);
        goto LAB_0010d30f;
      }
    }
    Next(this);
  }
LAB_0010d2fe:
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
LAB_0010d30f:
  *(int *)(in_RSI + 0x77c) = *(int *)(in_RSI + 0x77c) + -1;
  return SUB82(this,0);
}

Assistant:

explicit ParseDepthGuard(Parser *parser_not_null)
      : parser_(*parser_not_null), caller_depth_(parser_.parse_depth_counter_) {
    FLATBUFFERS_ASSERT(caller_depth_ <= (FLATBUFFERS_MAX_PARSING_DEPTH) &&
                       "Check() must be called to prevent stack overflow");
    parser_.parse_depth_counter_ += 1;
  }